

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utPLYImportExport.cpp
# Opt level: O2

void __thiscall
utPLYImportExport_importBinaryPLY_Test::utPLYImportExport_importBinaryPLY_Test
          (utPLYImportExport_importBinaryPLY_Test *this)

{
  utPLYImportExport::utPLYImportExport(&this->super_utPLYImportExport);
  (this->super_utPLYImportExport).super_AbstractImportExportBase.super_Test._vptr_Test =
       (_func_int **)&PTR__AbstractImportExportBase_007ee278;
  return;
}

Assistant:

TEST_F(utPLYImportExport, importBinaryPLY) {
    Assimp::Importer importer;
    const aiScene *scene = importer.ReadFile(ASSIMP_TEST_MODELS_DIR "/PLY/cube_binary.ply", aiProcess_ValidateDataStructure);

    EXPECT_NE(nullptr, scene);
    EXPECT_NE(nullptr, scene->mMeshes[0]);
    //This test model is double sided, so 12 faces instead of 6
    EXPECT_EQ(12u, scene->mMeshes[0]->mNumFaces);
}